

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O1

int dcmp(double x)

{
  int iVar1;
  
  iVar1 = 1;
  if (x <= 1e-09) {
    iVar1 = -(uint)(x < -1e-09);
  }
  return iVar1;
}

Assistant:

int dcmp(double x)
{
    if (x > eps)
        return 1;
    else if (x < -eps)
        return -1;
    else
        return 0;
}